

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ReportOnFunctionSelectError
               (ExpressionContext *ctx,SynBase *source,char *errorBuf,uint errorBufSize,
               char *messageStart,InplaceStr functionName,ArrayView<FunctionValue> functions,
               IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
               ArrayView<unsigned_int> ratings,uint bestRating,bool showInstanceInfo)

{
  int iVar1;
  FunctionData *function;
  TypeBase *pTVar2;
  Allocator *pAVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ArgumentData *pAVar11;
  FunctionValue *pFVar12;
  uint *puVar13;
  MatchData *pMVar14;
  TypeFunction *instance;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  uint i;
  uint uVar18;
  uint uVar19;
  IntrusiveList<TypeHandle> *pIVar20;
  size_t size;
  ulong uVar21;
  ExpressionContext *this;
  char *pcVar22;
  uint k_2;
  ExpressionContext *pEVar23;
  IntrusiveList<MatchData> *pIVar24;
  TypeHandle *pTVar25;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<CallArgumentData> arguments_02;
  SmallArray<CallArgumentData,_16U> result;
  TypeBase *local_188;
  IntrusiveList<MatchData> local_168;
  char *local_158;
  char *local_150;
  SmallArray<CallArgumentData,_16U> local_148;
  
  local_158 = messageStart;
  if (errorBuf == (char *)0x0) {
    __assert_fail("errorBuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x192e,
                  "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                 );
  }
  iVar9 = (int)errorBuf;
  local_188 = (TypeBase *)errorBuf;
  if (functionName.begin != functionName.end) {
    iVar8 = NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,"  %.*s",
                               (ulong)(uint)((int)functionName.end - (int)functionName.begin));
    pcVar17 = errorBuf + iVar8;
    size = (size_t)(errorBufSize - iVar8);
    if (generics.head == (TypeHandle *)0x0) {
      pcVar16 = "(";
    }
    else {
      iVar8 = NULLC::SafeSprintf(pcVar17,size,"<");
      pcVar17 = pcVar17 + iVar8;
      for (pTVar25 = generics.head; size = (size_t)((iVar9 - (int)pcVar17) + errorBufSize),
          pTVar25 != (TypeHandle *)0x0; pTVar25 = pTVar25->next) {
        pcVar16 = ", ";
        if (pTVar25 == generics.head) {
          pcVar16 = "";
        }
        iVar8 = NULLC::SafeSprintf(pcVar17,size,"%s%.*s",pcVar16,
                                   (ulong)(uint)(*(int *)&(pTVar25->type->name).end -
                                                (int)(pTVar25->type->name).begin));
        pcVar17 = pcVar17 + iVar8;
      }
      pcVar16 = ">(";
    }
    iVar8 = NULLC::SafeSprintf(pcVar17,size,pcVar16);
    pcVar17 = pcVar17 + iVar8;
    for (uVar18 = 0; uVar21 = (ulong)((iVar9 - (int)pcVar17) + errorBufSize),
        uVar18 < arguments.count; uVar18 = uVar18 + 1) {
      pcVar16 = ", ";
      if (uVar18 == 0) {
        pcVar16 = "";
      }
      pAVar11 = ArrayView<ArgumentData>::operator[](&arguments,uVar18);
      iVar8 = *(int *)&(pAVar11->type->name).end;
      pAVar11 = ArrayView<ArgumentData>::operator[](&arguments,uVar18);
      iVar1 = *(int *)&(pAVar11->type->name).begin;
      pAVar11 = ArrayView<ArgumentData>::operator[](&arguments,uVar18);
      iVar8 = NULLC::SafeSprintf(pcVar17,uVar21,"%s%.*s",pcVar16,(ulong)(uint)(iVar8 - iVar1),
                                 (pAVar11->type->name).begin);
      pcVar17 = pcVar17 + iVar8;
    }
    pcVar16 = ")\n";
    if (functions.count == 0) {
      pcVar16 = ")";
    }
    iVar8 = NULLC::SafeSprintf(pcVar17,uVar21,pcVar16);
    local_188 = (TypeBase *)(pcVar17 + iVar8);
  }
  if (functions.count != 0) {
    pcVar17 = " candidates are:\n";
    if (bestRating == 0xffffffff) {
      pcVar17 = " the only available are:\n";
    }
    iVar9 = NULLC::SafeSprintf((char *)local_188,(ulong)((iVar9 - (int)local_188) + errorBufSize),
                               pcVar17);
    local_188 = (TypeBase *)((long)local_188 + (long)iVar9);
  }
  uVar18 = 0;
  local_150 = errorBuf;
  do {
    if (functions.count <= uVar18) {
      pcVar17 = ctx->errorBufLocation;
      sVar15 = strlen(pcVar17);
      pcVar17 = pcVar17 + sVar15;
      ctx->errorBufLocation = pcVar17;
      anon_unknown.dwarf_ff84f::AddErrorInfoWithLocation(ctx,source,local_158,pcVar17);
      return;
    }
    pFVar12 = ArrayView<FunctionValue>::operator[](&functions,uVar18);
    function = pFVar12->function;
    if ((ratings.count == 0) ||
       (puVar13 = ArrayView<unsigned_int>::operator[](&ratings,uVar18), *puVar13 == bestRating)) {
      iVar8 = (int)errorBuf;
      pTVar2 = function->type->returnType;
      pcVar17 = (pTVar2->name).begin;
      pcVar16 = (function->name->name).begin;
      iVar9 = NULLC::SafeSprintf((char *)local_188,(ulong)((iVar8 - (int)local_188) + errorBufSize),
                                 "  %.*s %.*s",
                                 (ulong)(uint)(*(int *)&(pTVar2->name).end - (int)pcVar17),pcVar17,
                                 (ulong)(uint)(*(int *)&(function->name->name).end - (int)pcVar16),
                                 pcVar16);
      pEVar23 = (ExpressionContext *)((long)local_188 + (long)iVar9);
      if ((function->generics).head != (MatchData *)0x0) {
        uVar19 = 0;
        iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - (int)pEVar23) + errorBufSize),
                                   "<");
        pcVar17 = (char *)((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
        while( true ) {
          uVar10 = IntrusiveList<MatchData>::size(&function->generics);
          if (uVar10 <= uVar19) break;
          pMVar14 = IntrusiveList<MatchData>::operator[](&function->generics,uVar19);
          pcVar16 = ", ";
          if (uVar19 == 0) {
            pcVar16 = "";
          }
          iVar9 = NULLC::SafeSprintf(pcVar17,(ulong)((iVar8 - (int)pcVar17) + errorBufSize),"%s%.*s"
                                     ,pcVar16,(ulong)(uint)(*(int *)&(pMVar14->type->name).end -
                                                           (int)(pMVar14->type->name).begin));
          pcVar17 = pcVar17 + iVar9;
          uVar19 = uVar19 + 1;
        }
        iVar9 = NULLC::SafeSprintf(pcVar17,(ulong)((iVar8 - (int)pcVar17) + errorBufSize),">");
        pEVar23 = (ExpressionContext *)(pcVar17 + iVar9);
      }
      uVar19 = 0;
      this = pEVar23;
      iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - (int)pEVar23) + errorBufSize),"(")
      ;
      errorBuf = local_150;
      pEVar23 = (ExpressionContext *)
                ((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
      while( true ) {
        iVar9 = (int)pEVar23;
        iVar8 = (int)errorBuf;
        if ((function->arguments).count <= uVar19) break;
        pAVar11 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,uVar19);
        pcVar17 = ", ";
        pcVar16 = "";
        if (uVar19 == 0) {
          pcVar17 = "";
        }
        if (pAVar11->isExplicit != false) {
          pcVar16 = "explicit ";
        }
        pcVar22 = (pAVar11->type->name).begin;
        this = pEVar23;
        iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - iVar9) + errorBufSize),
                                   "%s%s%.*s",pcVar17,pcVar16,
                                   (ulong)(uint)(*(int *)&(pAVar11->type->name).end - (int)pcVar22),
                                   pcVar22);
        pEVar23 = (ExpressionContext *)
                  ((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
        uVar19 = uVar19 + 1;
      }
      bVar7 = ExpressionContext::IsGenericFunction(this,function);
      if (showInstanceInfo && bVar7) {
        pFVar12 = ArrayView<FunctionValue>::operator[](&functions,uVar18);
        local_188 = function->scope->ownerType;
        if ((TypeStruct *)pFVar12->context->type == ctx->typeAutoRef) {
          if (local_188 == (TypeBase *)0x0) {
            __assert_fail("function->scope->ownerType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1975,
                          "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                         );
          }
        }
        else if (local_188 == (TypeBase *)0x0) {
          local_188 = (TypeBase *)0x0;
        }
        else {
          pFVar12 = ArrayView<FunctionValue>::operator[](&functions,uVar18);
          local_188 = (TypeBase *)pFVar12->context->type[1]._vptr_TypeBase;
        }
        local_168.head = (MatchData *)0x0;
        local_168.tail = (MatchData *)0x0;
        pAVar3 = ctx->allocator;
        memset(local_148.little,0,0x100);
        local_148.data = local_148.little;
        local_148.count = 0;
        local_148.max = 0x10;
        uVar5 = (function->arguments).data;
        uVar6 = (function->arguments).count;
        functionArguments.count = uVar6;
        functionArguments.data = (ArgumentData *)uVar5;
        arguments_00.count = arguments.count;
        arguments_00.data = arguments.data;
        arguments_00._12_4_ = 0;
        functionArguments._12_4_ = 0;
        local_148.allocator = pAVar3;
        bVar7 = PrepareArgumentsForFunctionCall
                          (ctx,source,functionArguments,arguments_00,&local_148,(uint *)0x0,false);
        if ((bVar7) &&
           ((pFVar12 = ArrayView<FunctionValue>::operator[](&functions,uVar18),
            (TypeStruct *)pFVar12->context->type != ctx->typeAutoRef ||
            (generics.head == (TypeHandle *)0x0)))) {
          arguments_01.count = local_148.count;
          arguments_01.data = local_148.data;
          arguments_01._12_4_ = 0;
          instance = GetGenericFunctionInstanceType
                               (ctx,source,local_188,function,arguments_01,&local_168);
          if (instance == (TypeFunction *)0x0) {
            iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - iVar9) + errorBufSize),
                                       ") (wasn\'t instanced here)");
          }
          else {
            arguments_02.count = local_148.count;
            arguments_02.data = local_148.data;
            arguments_02._12_4_ = 0;
            GetFunctionRating(ctx,function,instance,arguments_02);
            pTVar2 = function->type->returnType;
            pcVar17 = (pTVar2->name).begin;
            pcVar16 = (function->name->name).begin;
            iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - iVar9) + errorBufSize),
                                       ") instanced to\n    %.*s %.*s(",
                                       (ulong)(uint)(*(int *)&(pTVar2->name).end - (int)pcVar17),
                                       pcVar17,(ulong)(uint)(*(int *)&(function->name->name).end -
                                                            (int)pcVar16),pcVar16);
            pEVar23 = (ExpressionContext *)
                      ((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
            pIVar20 = &instance->arguments;
            for (uVar19 = 0; uVar19 < (function->arguments).count; uVar19 = uVar19 + 1) {
              pTVar25 = pIVar20->head;
              pAVar11 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,uVar19);
              pcVar17 = ", ";
              pcVar22 = "";
              if (uVar19 == 0) {
                pcVar17 = "";
              }
              if (pAVar11->isExplicit != false) {
                pcVar22 = "explicit ";
              }
              pTVar2 = pTVar25->type;
              pcVar16 = (pTVar2->name).begin;
              iVar9 = NULLC::SafeSprintf((char *)pEVar23,
                                         (ulong)((iVar8 - (int)pEVar23) + errorBufSize),"%s%s%.*s",
                                         pcVar17,pcVar22,
                                         (ulong)(uint)(*(int *)&(pTVar2->name).end - (int)pcVar16),
                                         pcVar16);
              pEVar23 = (ExpressionContext *)
                        ((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
              pIVar20 = (IntrusiveList<TypeHandle> *)&pTVar25->next;
            }
            uVar21 = (ulong)((iVar8 - (int)pEVar23) + errorBufSize);
            if (local_168.head == (MatchData *)0x0) {
              iVar9 = NULLC::SafeSprintf((char *)pEVar23,uVar21,")");
            }
            else {
              iVar9 = NULLC::SafeSprintf((char *)pEVar23,uVar21,") with [");
              pEVar23 = (ExpressionContext *)
                        ((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
              pIVar24 = &local_168;
              while( true ) {
                pMVar14 = pIVar24->head;
                uVar21 = (ulong)((iVar8 - (int)pEVar23) + errorBufSize);
                if (pMVar14 == (MatchData *)0x0) break;
                pcVar17 = ", ";
                if (pMVar14 == local_168.head) {
                  pcVar17 = "";
                }
                pcVar22 = (pMVar14->name->name).begin;
                pcVar4 = (pMVar14->type->name).begin;
                pcVar16 = (char *)CONCAT44((int)((ulong)pcVar16 >> 0x20),
                                           *(int *)&(pMVar14->type->name).end - (int)pcVar4);
                iVar9 = NULLC::SafeSprintf((char *)pEVar23,uVar21,"%s%.*s = %.*s",pcVar17,
                                           (ulong)(uint)(*(int *)&(pMVar14->name->name).end -
                                                        (int)pcVar22),pcVar22,pcVar16,pcVar4);
                pEVar23 = (ExpressionContext *)
                          ((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
                pIVar24 = (IntrusiveList<MatchData> *)&pMVar14->next;
              }
              iVar9 = NULLC::SafeSprintf((char *)pEVar23,uVar21,"]");
            }
          }
        }
        else {
          iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - iVar9) + errorBufSize),
                                     ") (wasn\'t instanced here)");
        }
        pcVar17 = (char *)((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
        SmallArray<CallArgumentData,_16U>::~SmallArray(&local_148);
      }
      else {
        iVar9 = NULLC::SafeSprintf((char *)pEVar23,(ulong)((iVar8 - iVar9) + errorBufSize),")");
        pcVar17 = (char *)((long)(pEVar23->uniqueDependencies).little + (long)iVar9 + -0x30);
      }
      iVar9 = NULLC::SafeSprintf(pcVar17,(ulong)((iVar8 - (int)pcVar17) + errorBufSize),"\n");
      local_188 = (TypeBase *)(pcVar17 + iVar9);
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void ReportOnFunctionSelectError(ExpressionContext &ctx, SynBase *source, char* errorBuf, unsigned errorBufSize, const char *messageStart, InplaceStr functionName, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, ArrayView<unsigned> ratings, unsigned bestRating, bool showInstanceInfo)
{
	assert(errorBuf);

	char *errPos = errorBuf;

	if(!functionName.empty())
	{
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s", FMT_ISTR(functionName));

		if(!generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(TypeHandle *el = generics.head; el; el = el->next)
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", el != generics.head ? ", " : "", FMT_ISTR(el->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">(");
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), !functions.empty() ? ")\n" : ")");
	}

	if(!functions.empty())
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), bestRating == ~0u ? " the only available are:\n" : " candidates are:\n");

	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i].function;

		if(!ratings.empty() && ratings[i] != bestRating)
			continue;

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s %.*s", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

		if(!function->generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(unsigned k = 0; k < function->generics.size(); k++)
			{
				MatchData *match = function->generics[k];

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", k != 0 ? ", " : "", FMT_ISTR(match->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");

		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name));
		}

		if(ctx.IsGenericFunction(function) && showInstanceInfo)
		{
			TypeBase *parentType = NULL;

			if(functions[i].context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(functions[i].context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;
			SmallArray<CallArgumentData, 16> result(ctx.allocator);

			// Handle named argument order, default argument values and variadic functions
			if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false) || (functions[i].context->type == ctx.typeAutoRef && !generics.empty()))
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
			else if(TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases))
			{
				GetFunctionRating(ctx, function, instance, result);

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") instanced to\n    %.*s %.*s(", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

				TypeHandle *curr = instance->arguments.head;

				for(unsigned k = 0; k < function->arguments.size(); k++)
				{
					ArgumentData &argument = function->arguments[k];

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(curr->type->name));

					curr = curr->next;
				}

				if(!aliases.empty())
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") with [");

					for(MatchData *curr = aliases.head; curr; curr = curr->next)
						errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "]");
				}
				else
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
				}
			}
			else
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\n");
	}

	ctx.errorBufLocation += strlen(ctx.errorBufLocation);

	const char *messageEnd = ctx.errorBufLocation;

	AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
}